

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int PAL_fclose(PAL_FILE *f)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (f == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_fclose",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x259);
      fprintf(_stderr,"Expression: f != NULL\n");
    }
    iVar1 = fclose((FILE *)f->bsdFilePtr);
    PAL_free(f);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

int
_cdecl
PAL_fclose(PAL_FILE * f)
{
    INT nRetVal = 0;

    PERF_ENTRY(fclose);
    ENTRY( "fclose( f=%p )\n", f );

    _ASSERTE(f != NULL);

    CLEARERR(f);

    nRetVal = fclose( f->bsdFilePtr );
    PAL_free( f );

    LOGEXIT( "fclose returning %d\n", nRetVal );
    PERF_EXIT(fclose);
    return nRetVal;
}